

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImGui::ParseFormatPrecision(char *fmt,int default_precision)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  
  while( true ) {
    pcVar4 = strchr(fmt,0x25);
    if (pcVar4 == (char *)0x0) {
      return default_precision;
    }
    cVar2 = pcVar4[1];
    if (cVar2 != '%') break;
    fmt = pcVar4 + 2;
  }
  while ((byte)(cVar2 - 0x30U) < 10) {
    pcVar1 = pcVar4 + 2;
    pcVar4 = pcVar4 + 1;
    cVar2 = *pcVar1;
  }
  if (cVar2 != '.') {
    return default_precision;
  }
  uVar3 = atoi(pcVar4 + 2);
  if (10 < uVar3) {
    return default_precision;
  }
  return uVar3;
}

Assistant:

int ImGui::ParseFormatPrecision(const char* fmt, int default_precision)
{
    int precision = default_precision;
    while ((fmt = strchr(fmt, '%')) != NULL)
    {
        fmt++;
        if (fmt[0] == '%') { fmt++; continue; } // Ignore "%%"
        while (*fmt >= '0' && *fmt <= '9')
            fmt++;
        if (*fmt == '.')
        {
            precision = atoi(fmt + 1);
            if (precision < 0 || precision > 10)
                precision = default_precision;
        }
        break;
    }
    return precision;
}